

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  allocator<char> local_b1;
  string local_b0;
  string stderr_file;
  string stdout_file;
  string expected_file;
  string stdin_file;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x106228) = 0;
  if (argc == 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stdin_file,argv[1],(allocator<char> *)&expected_file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expected_file,argv[2],(allocator<char> *)&stdout_file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stdout_file,argv[3],(allocator<char> *)&stderr_file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stderr_file,argv[4],(allocator<char> *)&local_b0);
    iVar1 = execute_main_with_dummy_stdio(&stdin_file,&expected_file,&stdout_file,&stderr_file);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"input",&local_b1);
    output_with_header(&stdin_file,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"output",&local_b1);
    output_with_header(&stdout_file,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"expected",&local_b1);
    output_with_header(&expected_file,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"stderr",&local_b1);
    output_with_header(&stderr_file,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&stderr_file);
    std::__cxx11::string::~string((string *)&stdout_file);
    std::__cxx11::string::~string((string *)&expected_file);
    std::__cxx11::string::~string((string *)&stdin_file);
  }
  else {
    if (argc == 2) {
      freopen(argv[1],"r",_stdin);
    }
    else if (argc != 1) {
      return 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    std::ios::sync_with_stdio(false);
    std::cin.tie(nullptr);

#ifndef MAY_RUN_TEST_CASE
    return my_main(argc, argv);
#else
    if (argc == 1) {
        return my_main(argc, argv);
    } else if (argc == 2) {

        char* stdin_file = argv[1];
        freopen(stdin_file, "r", stdin);
        return my_main(argc, argv);

    } else if (argc == 5) {
        std::string stdin_file = argv[1];
        std::string expected_file = argv[2];
        std::string stdout_file = argv[3];
        std::string stderr_file = argv[4];

        const auto ret = execute_main_with_dummy_stdio(stdin_file, expected_file, stdout_file, stderr_file);
        output_with_header(stdin_file, "input");
        output_with_header(stdout_file, "output");
        output_with_header(expected_file, "expected");
        output_with_header(stderr_file, "stderr");
        return ret;

    }
    return 1;
#endif
}